

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::avx2::
BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  undefined4 uVar15;
  uint uVar16;
  ulong *puVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  RayQueryContext *pRVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  RayQueryContext *pRVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  uint uVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined8 uVar48;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar67;
  uint uVar68;
  undefined1 auVar66 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2644;
  undefined1 local_2640 [16];
  long local_2630;
  ulong local_2628;
  ulong local_2620;
  ulong local_2618;
  RayQueryContext *local_2610;
  RayHit *local_2608;
  long local_2600;
  long local_25f8;
  int *local_25f0;
  RayQueryContext *local_25e8;
  undefined4 *local_25e0;
  Intersectors *local_25d8;
  undefined4 *local_25d0;
  undefined4 local_25c8;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  float local_25b4;
  float local_25b0;
  undefined4 local_25ac;
  uint local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [2] [16];
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_2608 = ray;
    pauVar28 = (undefined1 (*) [16])local_2390;
    local_23a0 = *(long *)(*(long *)this + 0x70);
    uStack_2398 = 0;
    auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
    auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)&(This->intersector1).intersect));
    local_2490._8_4_ = 0x7fffffff;
    local_2490._0_8_ = 0x7fffffff7fffffff;
    local_2490._12_4_ = 0x7fffffff;
    auVar34 = vandps_avx((undefined1  [16])This->collider,local_2490);
    auVar54._8_4_ = 0x219392ef;
    auVar54._0_8_ = 0x219392ef219392ef;
    auVar54._12_4_ = 0x219392ef;
    auVar34 = vcmpps_avx(auVar34,auVar54,1);
    auVar34 = vblendvps_avx((undefined1  [16])This->collider,auVar54,auVar34);
    auVar54 = vrcpps_avx(auVar34);
    auVar55._8_4_ = 0x3f800000;
    auVar55._0_8_ = 0x3f8000003f800000;
    auVar55._12_4_ = 0x3f800000;
    auVar34 = vfnmadd213ps_fma(auVar34,auVar54,auVar55);
    auVar12 = vfmadd132ps_fma(auVar34,auVar54,auVar54);
    fVar44 = auVar12._0_4_;
    local_23c0._4_4_ = fVar44;
    local_23c0._0_4_ = fVar44;
    local_23c0._8_4_ = fVar44;
    local_23c0._12_4_ = fVar44;
    local_23c0._16_4_ = fVar44;
    local_23c0._20_4_ = fVar44;
    local_23c0._24_4_ = fVar44;
    local_23c0._28_4_ = fVar44;
    auVar66 = ZEXT3264(local_23c0);
    auVar34 = vmovshdup_avx(auVar12);
    uVar48 = auVar34._0_8_;
    local_23e0._8_8_ = uVar48;
    local_23e0._0_8_ = uVar48;
    local_23e0._16_8_ = uVar48;
    local_23e0._24_8_ = uVar48;
    auVar70 = ZEXT3264(local_23e0);
    auVar55 = vshufpd_avx(auVar12,auVar12,1);
    auVar54 = vshufps_avx(auVar12,auVar12,0xaa);
    uVar48 = auVar54._0_8_;
    local_2400._8_8_ = uVar48;
    local_2400._0_8_ = uVar48;
    local_2400._16_8_ = uVar48;
    local_2400._24_8_ = uVar48;
    auVar76 = ZEXT3264(local_2400);
    auVar45._0_4_ = fVar44 * *(float *)&This->ptr;
    auVar45._4_4_ = auVar12._4_4_ * *(float *)((long)&This->ptr + 4);
    auVar45._8_4_ = auVar12._8_4_ * *(float *)&This->leafIntersector;
    auVar45._12_4_ = auVar12._12_4_ * *(float *)((long)&This->leafIntersector + 4);
    auVar54 = vmovshdup_avx(auVar45);
    auVar12 = vshufps_avx(auVar45,auVar45,0xaa);
    uVar25 = (ulong)(fVar44 < 0.0) << 3;
    uVar26 = (ulong)(auVar34._0_4_ < 0.0) * 8 + 0x10;
    uVar24 = (ulong)(auVar55._0_4_ < 0.0) * 8 + 0x20;
    uVar15 = auVar8._0_4_;
    auVar36 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,CONCAT412
                                                  (uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))))
                                                  ))));
    uVar27 = uVar25 ^ 8;
    uVar31 = uVar26 ^ 8;
    uVar22 = uVar24 ^ 8;
    uVar30 = CONCAT44(auVar45._0_4_,auVar45._0_4_);
    local_2420._0_8_ = uVar30 ^ 0x8000000080000000;
    local_2420._8_4_ = -auVar45._0_4_;
    local_2420._12_4_ = -auVar45._0_4_;
    local_2420._16_4_ = -auVar45._0_4_;
    local_2420._20_4_ = -auVar45._0_4_;
    local_2420._24_4_ = -auVar45._0_4_;
    local_2420._28_4_ = -auVar45._0_4_;
    auVar78 = ZEXT3264(local_2420);
    uVar16 = auVar54._0_4_;
    uVar47 = auVar54._4_4_;
    local_2440._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    local_2440._8_4_ = uVar16 ^ 0x80000000;
    local_2440._12_4_ = uVar47 ^ 0x80000000;
    local_2440._16_4_ = uVar16 ^ 0x80000000;
    local_2440._20_4_ = uVar47 ^ 0x80000000;
    local_2440._24_4_ = uVar16 ^ 0x80000000;
    local_2440._28_4_ = uVar47 ^ 0x80000000;
    auVar81 = ZEXT3264(local_2440);
    uVar16 = auVar12._0_4_;
    uVar47 = auVar12._4_4_;
    local_2460._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
    local_2460._8_4_ = uVar16 ^ 0x80000000;
    local_2460._12_4_ = uVar47 ^ 0x80000000;
    local_2460._16_4_ = uVar16 ^ 0x80000000;
    local_2460._20_4_ = uVar47 ^ 0x80000000;
    local_2460._24_4_ = uVar16 ^ 0x80000000;
    local_2460._28_4_ = uVar47 ^ 0x80000000;
    auVar84 = ZEXT3264(local_2460);
    uVar15 = auVar7._0_4_;
    local_2480._4_4_ = uVar15;
    local_2480._0_4_ = uVar15;
    local_2480._8_4_ = uVar15;
    local_2480._12_4_ = uVar15;
    local_2480._16_4_ = uVar15;
    local_2480._20_4_ = uVar15;
    local_2480._24_4_ = uVar15;
    local_2480._28_4_ = uVar15;
    auVar86 = ZEXT3264(local_2480);
    local_2570 = mm_lookupmask_ps._240_8_;
    uStack_2568 = mm_lookupmask_ps._248_8_;
LAB_0152d226:
    if (pauVar28 != (undefined1 (*) [16])&local_23a0) {
      pauVar18 = pauVar28 + -1;
      pauVar28 = pauVar28 + -1;
      if (*(float *)(*pauVar18 + 8) <= *(float *)&(This->intersector1).intersect) {
        pRVar29 = *(RayQueryContext **)*pauVar28;
        while (((ulong)pRVar29 & 8) == 0) {
          uVar30 = (ulong)pRVar29 & 0xfffffffffffffff0;
          puVar17 = (ulong *)(uVar30 + 0x40);
          if (uVar30 == 0) {
            puVar17 = (ulong *)0x0;
          }
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *puVar17;
          auVar8 = vpmovzxbw_avx(auVar34);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = puVar17[1];
          auVar34 = vpmovzxbw_avx(auVar7);
          auVar34 = vpminuw_avx(auVar8,auVar34);
          auVar34 = vpcmpeqw_avx(auVar8,auVar34);
          auVar34 = vpacksswb_avx(auVar34,auVar34);
          uVar15 = (undefined4)puVar17[6];
          auVar51._4_4_ = uVar15;
          auVar51._0_4_ = uVar15;
          auVar51._8_4_ = uVar15;
          auVar51._12_4_ = uVar15;
          auVar51._16_4_ = uVar15;
          auVar51._20_4_ = uVar15;
          auVar51._24_4_ = uVar15;
          auVar51._28_4_ = uVar15;
          uVar15 = *(undefined4 *)((long)puVar17 + 0x3c);
          auVar57._4_4_ = uVar15;
          auVar57._0_4_ = uVar15;
          auVar57._8_4_ = uVar15;
          auVar57._12_4_ = uVar15;
          auVar57._16_4_ = uVar15;
          auVar57._20_4_ = uVar15;
          auVar57._24_4_ = uVar15;
          auVar57._28_4_ = uVar15;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)puVar17 + uVar25);
          auVar10 = vpmovzxbd_avx2(auVar8);
          auVar10 = vcvtdq2ps_avx(auVar10);
          auVar7 = vfmadd213ps_fma(auVar10,auVar57,auVar51);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)((long)puVar17 + uVar27);
          auVar10 = vpmovzxbd_avx2(auVar12);
          auVar10 = vcvtdq2ps_avx(auVar10);
          auVar8 = vfmadd213ps_fma(auVar10,auVar57,auVar51);
          uVar15 = *(undefined4 *)((long)puVar17 + 0x34);
          auVar52._4_4_ = uVar15;
          auVar52._0_4_ = uVar15;
          auVar52._8_4_ = uVar15;
          auVar52._12_4_ = uVar15;
          auVar52._16_4_ = uVar15;
          auVar52._20_4_ = uVar15;
          auVar52._24_4_ = uVar15;
          auVar52._28_4_ = uVar15;
          uVar15 = (undefined4)puVar17[8];
          auVar58._4_4_ = uVar15;
          auVar58._0_4_ = uVar15;
          auVar58._8_4_ = uVar15;
          auVar58._12_4_ = uVar15;
          auVar58._16_4_ = uVar15;
          auVar58._20_4_ = uVar15;
          auVar58._24_4_ = uVar15;
          auVar58._28_4_ = uVar15;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)puVar17 + uVar26);
          auVar10 = vpmovzxbd_avx2(auVar3);
          auVar10 = vcvtdq2ps_avx(auVar10);
          auVar54 = vfmadd213ps_fma(auVar10,auVar58,auVar52);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)((long)puVar17 + uVar31);
          auVar10 = vpmovzxbd_avx2(auVar4);
          auVar10 = vcvtdq2ps_avx(auVar10);
          auVar55 = vfmadd213ps_fma(auVar10,auVar58,auVar52);
          uVar15 = (undefined4)puVar17[7];
          auVar53._4_4_ = uVar15;
          auVar53._0_4_ = uVar15;
          auVar53._8_4_ = uVar15;
          auVar53._12_4_ = uVar15;
          auVar53._16_4_ = uVar15;
          auVar53._20_4_ = uVar15;
          auVar53._24_4_ = uVar15;
          auVar53._28_4_ = uVar15;
          uVar15 = *(undefined4 *)((long)puVar17 + 0x44);
          auVar59._4_4_ = uVar15;
          auVar59._0_4_ = uVar15;
          auVar59._8_4_ = uVar15;
          auVar59._12_4_ = uVar15;
          auVar59._16_4_ = uVar15;
          auVar59._20_4_ = uVar15;
          auVar59._24_4_ = uVar15;
          auVar59._28_4_ = uVar15;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((long)puVar17 + uVar24);
          auVar10 = vpmovzxbd_avx2(auVar5);
          context = (RayQueryContext *)0x0;
          auVar10 = vcvtdq2ps_avx(auVar10);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)((long)puVar17 + uVar22);
          auVar51 = vpmovzxbd_avx2(auVar6);
          auVar12 = vfmadd213ps_fma(auVar10,auVar59,auVar53);
          auVar10 = vcvtdq2ps_avx(auVar51);
          auVar45 = vfmadd213ps_fma(auVar10,auVar59,auVar53);
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar66._0_32_,auVar78._0_32_);
          auVar54 = vfmadd213ps_fma(ZEXT1632(auVar54),auVar70._0_32_,auVar81._0_32_);
          auVar10 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar54));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar76._0_32_,auVar84._0_32_);
          auVar51 = vpmaxsd_avx2(ZEXT1632(auVar7),auVar86._0_32_);
          local_2560 = vpmaxsd_avx2(auVar10,auVar51);
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar66._0_32_,auVar78._0_32_);
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar70._0_32_,auVar81._0_32_);
          auVar10 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
          auVar7 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar76._0_32_,auVar84._0_32_);
          auVar51 = vpminsd_avx2(ZEXT1632(auVar7),auVar36._0_32_);
          auVar10 = vpminsd_avx2(auVar10,auVar51);
          auVar10 = vpcmpgtd_avx2(local_2560,auVar10);
          uVar15 = vmovmskps_avx(auVar10);
          bVar14 = ~(byte)uVar15 &
                   (SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar34 >> 0x17,0) & 1) << 2 | (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar34 >> 0x27,0) & 1) << 4 | (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar34 >> 0x37,0) & 1) << 6 | SUB161(auVar34 >> 0x3f,0) << 7);
          if (bVar14 == 0) goto LAB_0152d226;
          lVar20 = 0;
          for (uVar19 = (ulong)bVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
          {
            lVar20 = lVar20 + 1;
          }
          context = *(RayQueryContext **)(uVar30 + lVar20 * 8);
          uVar16 = bVar14 - 1 & (uint)bVar14;
          uVar19 = (ulong)uVar16;
          pRVar29 = context;
          if (uVar16 != 0) {
            uVar47 = *(uint *)(local_2560 + lVar20 * 4);
            lVar20 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar16 = uVar16 - 1 & uVar16;
            uVar19 = (ulong)uVar16;
            pRVar29 = *(RayQueryContext **)(uVar30 + lVar20 * 8);
            uVar67 = *(uint *)(local_2560 + lVar20 * 4);
            if (uVar16 == 0) {
              if (uVar47 < uVar67) {
                *(RayQueryContext **)*pauVar28 = pRVar29;
                *(uint *)(*pauVar28 + 8) = uVar67;
                pauVar28 = pauVar28 + 1;
                pRVar29 = context;
              }
              else {
                *(RayQueryContext **)*pauVar28 = context;
                *(uint *)(*pauVar28 + 8) = uVar47;
                context = pRVar29;
                pauVar28 = pauVar28 + 1;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = context;
              auVar34 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar47));
              auVar42._8_8_ = 0;
              auVar42._0_8_ = pRVar29;
              auVar7 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar67));
              lVar20 = 0;
              for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar16 = uVar16 - 1 & uVar16;
              uVar19 = (ulong)uVar16;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)(uVar30 + lVar20 * 8);
              auVar54 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2560 + lVar20 * 4)));
              auVar8 = vpcmpgtd_avx(auVar7,auVar34);
              if (uVar16 == 0) {
                auVar55 = vpshufd_avx(auVar8,0xaa);
                auVar8 = vblendvps_avx(auVar7,auVar34,auVar55);
                auVar34 = vblendvps_avx(auVar34,auVar7,auVar55);
                auVar7 = vpcmpgtd_avx(auVar54,auVar8);
                auVar55 = vpshufd_avx(auVar7,0xaa);
                auVar7 = vblendvps_avx(auVar54,auVar8,auVar55);
                auVar8 = vblendvps_avx(auVar8,auVar54,auVar55);
                auVar54 = vpcmpgtd_avx(auVar8,auVar34);
                auVar55 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar8,auVar34,auVar55);
                auVar34 = vblendvps_avx(auVar34,auVar8,auVar55);
                *pauVar28 = auVar34;
                pauVar28[1] = auVar54;
                context = auVar7._0_8_;
                pauVar28 = pauVar28 + 2;
                pRVar29 = context;
              }
              else {
                lVar20 = 0;
                for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
                uVar16 = uVar16 - 1 & uVar16;
                uVar19 = (ulong)uVar16;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar30 + lVar20 * 8);
                auVar55 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_2560 + lVar20 * 4)));
                if (uVar16 == 0) {
                  auVar12 = vpshufd_avx(auVar8,0xaa);
                  auVar8 = vblendvps_avx(auVar7,auVar34,auVar12);
                  auVar34 = vblendvps_avx(auVar34,auVar7,auVar12);
                  auVar7 = vpcmpgtd_avx(auVar55,auVar54);
                  auVar12 = vpshufd_avx(auVar7,0xaa);
                  auVar7 = vblendvps_avx(auVar55,auVar54,auVar12);
                  auVar54 = vblendvps_avx(auVar54,auVar55,auVar12);
                  auVar55 = vpcmpgtd_avx(auVar54,auVar34);
                  auVar12 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar54,auVar34,auVar12);
                  auVar34 = vblendvps_avx(auVar34,auVar54,auVar12);
                  auVar54 = vpcmpgtd_avx(auVar7,auVar8);
                  auVar12 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar7,auVar8,auVar12);
                  auVar7 = vblendvps_avx(auVar8,auVar7,auVar12);
                  auVar8 = vpcmpgtd_avx(auVar55,auVar7);
                  auVar12 = vpshufd_avx(auVar8,0xaa);
                  auVar8 = vblendvps_avx(auVar55,auVar7,auVar12);
                  auVar7 = vblendvps_avx(auVar7,auVar55,auVar12);
                  *pauVar28 = auVar34;
                  pauVar28[1] = auVar7;
                  pauVar28[2] = auVar8;
                  context = auVar54._0_8_;
                  pauVar28 = pauVar28 + 3;
                  pRVar29 = auVar54._0_8_;
                }
                else {
                  *pauVar28 = auVar34;
                  pauVar28[1] = auVar7;
                  pauVar28[2] = auVar54;
                  pauVar18 = pauVar28 + 3;
                  pauVar28[3] = auVar55;
                  do {
                    lVar20 = 0;
                    for (uVar11 = uVar19; (uVar11 & 1) == 0;
                        uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                      lVar20 = lVar20 + 1;
                    }
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = *(ulong *)(uVar30 + lVar20 * 8);
                    auVar34 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_2560 + lVar20 * 4)));
                    pauVar18[1] = auVar34;
                    pauVar18 = pauVar18 + 1;
                    uVar19 = uVar19 - 1 & uVar19;
                  } while (uVar19 != 0);
                  lVar20 = 0;
                  while (pauVar18 != pauVar28) {
                    auVar34 = pauVar28[1];
                    uVar16 = vextractps_avx(auVar34,2);
                    for (lVar23 = 0x10;
                        (lVar20 != lVar23 && (*(uint *)(pauVar28[-1] + lVar23 + 8) < uVar16));
                        lVar23 = lVar23 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar28 + lVar23) =
                           *(undefined1 (*) [16])(pauVar28[-1] + lVar23);
                    }
                    *(undefined1 (*) [16])(*pauVar28 + lVar23) = auVar34;
                    lVar20 = lVar20 + -0x10;
                    pauVar28 = pauVar28 + 1;
                  }
                  context = *(RayQueryContext **)*pauVar18;
                  pauVar28 = pauVar18;
                  pRVar29 = context;
                }
              }
            }
          }
        }
        lVar20 = (ulong)((uint)pRVar29 & 0xf) - 8;
        uVar30 = (ulong)pRVar29 & 0xfffffffffffffff0;
        for (local_2600 = 0; local_2600 != lVar20; local_2600 = local_2600 + 1) {
          lVar23 = local_2600 * 0xb0;
          auVar34 = *(undefined1 (*) [16])(uVar30 + 0x80 + lVar23);
          auVar7 = *(undefined1 (*) [16])(uVar30 + 0x40 + lVar23);
          auVar8 = *(undefined1 (*) [16])(uVar30 + 0x70 + lVar23);
          auVar54 = *(undefined1 (*) [16])(uVar30 + 0x50 + lVar23);
          auVar32._0_4_ = auVar34._0_4_ * auVar7._0_4_;
          auVar32._4_4_ = auVar34._4_4_ * auVar7._4_4_;
          auVar32._8_4_ = auVar34._8_4_ * auVar7._8_4_;
          auVar32._12_4_ = auVar34._12_4_ * auVar7._12_4_;
          local_24d0 = vfmsub231ps_fma(auVar32,auVar8,auVar54);
          auVar55 = *(undefined1 (*) [16])(uVar30 + 0x60 + lVar23);
          auVar12 = *(undefined1 (*) [16])(uVar30 + 0x30 + lVar23);
          auVar39._0_4_ = auVar54._0_4_ * auVar55._0_4_;
          auVar39._4_4_ = auVar54._4_4_ * auVar55._4_4_;
          auVar39._8_4_ = auVar54._8_4_ * auVar55._8_4_;
          auVar39._12_4_ = auVar54._12_4_ * auVar55._12_4_;
          local_24c0 = vfmsub231ps_fma(auVar39,auVar34,auVar12);
          uVar15 = *(undefined4 *)&This->ptr;
          auVar71._4_4_ = uVar15;
          auVar71._0_4_ = uVar15;
          auVar71._8_4_ = uVar15;
          auVar71._12_4_ = uVar15;
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + lVar23),auVar71);
          uVar15 = *(undefined4 *)((long)&This->ptr + 4);
          auVar72._4_4_ = uVar15;
          auVar72._0_4_ = uVar15;
          auVar72._8_4_ = uVar15;
          auVar72._12_4_ = uVar15;
          auVar3 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x10 + lVar23),auVar72);
          uVar15 = *(undefined4 *)&This->leafIntersector;
          auVar73._4_4_ = uVar15;
          auVar73._0_4_ = uVar15;
          auVar73._8_4_ = uVar15;
          auVar73._12_4_ = uVar15;
          auVar4 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + lVar23),auVar73);
          fVar44 = *(float *)&(This->collider).collide;
          auVar74._4_4_ = fVar44;
          auVar74._0_4_ = fVar44;
          auVar74._8_4_ = fVar44;
          auVar74._12_4_ = fVar44;
          fVar61 = *(float *)((long)&(This->collider).collide + 4);
          auVar77._4_4_ = fVar61;
          auVar77._0_4_ = fVar61;
          auVar77._8_4_ = fVar61;
          auVar77._12_4_ = fVar61;
          fVar62 = *(float *)&(This->collider).name;
          auVar79._4_4_ = fVar62;
          auVar79._0_4_ = fVar62;
          auVar79._8_4_ = fVar62;
          auVar79._12_4_ = fVar62;
          auVar82._0_4_ = fVar44 * auVar3._0_4_;
          auVar82._4_4_ = fVar44 * auVar3._4_4_;
          auVar82._8_4_ = fVar44 * auVar3._8_4_;
          auVar82._12_4_ = fVar44 * auVar3._12_4_;
          auVar5 = vfmsub231ps_fma(auVar82,auVar45,auVar77);
          auVar69._0_4_ = auVar34._0_4_ * auVar5._0_4_;
          auVar69._4_4_ = auVar34._4_4_ * auVar5._4_4_;
          auVar69._8_4_ = auVar34._8_4_ * auVar5._8_4_;
          auVar69._12_4_ = auVar34._12_4_ * auVar5._12_4_;
          auVar83._0_4_ = auVar54._0_4_ * auVar5._0_4_;
          auVar83._4_4_ = auVar54._4_4_ * auVar5._4_4_;
          auVar83._8_4_ = auVar54._8_4_ * auVar5._8_4_;
          auVar83._12_4_ = auVar54._12_4_ * auVar5._12_4_;
          auVar65._0_4_ = fVar62 * auVar45._0_4_;
          auVar65._4_4_ = fVar62 * auVar45._4_4_;
          auVar65._8_4_ = fVar62 * auVar45._8_4_;
          auVar65._12_4_ = fVar62 * auVar45._12_4_;
          auVar54 = vfmsub231ps_fma(auVar65,auVar4,auVar74);
          auVar34 = vfmadd231ps_fma(auVar69,auVar54,auVar8);
          auVar54 = vfmadd231ps_fma(auVar83,auVar7,auVar54);
          auVar64._0_4_ = auVar8._0_4_ * auVar12._0_4_;
          auVar64._4_4_ = auVar8._4_4_ * auVar12._4_4_;
          auVar64._8_4_ = auVar8._8_4_ * auVar12._8_4_;
          auVar64._12_4_ = auVar8._12_4_ * auVar12._12_4_;
          local_24b0[0] = vfmsub231ps_fma(auVar64,auVar55,auVar7);
          auVar85._0_4_ = fVar61 * auVar4._0_4_;
          auVar85._4_4_ = fVar61 * auVar4._4_4_;
          auVar85._8_4_ = fVar61 * auVar4._8_4_;
          auVar85._12_4_ = fVar61 * auVar4._12_4_;
          auVar5 = vfmsub231ps_fma(auVar85,auVar3,auVar79);
          auVar80._0_4_ = local_24b0[0]._0_4_ * fVar62;
          auVar80._4_4_ = local_24b0[0]._4_4_ * fVar62;
          auVar80._8_4_ = local_24b0[0]._8_4_ * fVar62;
          auVar80._12_4_ = local_24b0[0]._12_4_ * fVar62;
          auVar7 = vfmadd231ps_fma(auVar80,local_24c0,auVar77);
          auVar8 = vfmadd231ps_fma(auVar7,local_24d0,auVar74);
          auVar7 = vfmadd231ps_fma(auVar34,auVar5,auVar55);
          auVar60._8_8_ = 0x8000000080000000;
          auVar60._0_8_ = 0x8000000080000000;
          auVar34 = vandps_avx(auVar8,auVar60);
          uVar16 = auVar34._0_4_;
          local_2560._0_4_ = (float)(uVar16 ^ auVar7._0_4_);
          uVar47 = auVar34._4_4_;
          local_2560._4_4_ = (float)(uVar47 ^ auVar7._4_4_);
          uVar67 = auVar34._8_4_;
          local_2560._8_4_ = (float)(uVar67 ^ auVar7._8_4_);
          uVar68 = auVar34._12_4_;
          local_2560._12_4_ = (float)(uVar68 ^ auVar7._12_4_);
          auVar34 = vfmadd231ps_fma(auVar54,auVar12,auVar5);
          local_2560._16_4_ = (float)(uVar16 ^ auVar34._0_4_);
          local_2560._20_4_ = (float)(uVar47 ^ auVar34._4_4_);
          local_2560._24_4_ = (float)(uVar67 ^ auVar34._8_4_);
          local_2560._28_4_ = (float)(uVar68 ^ auVar34._12_4_);
          auVar54 = ZEXT416(0) << 0x20;
          auVar34 = vcmpps_avx(local_2560._0_16_,auVar54,5);
          auVar7 = vcmpps_avx(local_2560._16_16_,auVar54,5);
          auVar34 = vandps_avx(auVar7,auVar34);
          local_2530 = vandps_avx(auVar8,local_2490);
          auVar7 = vcmpps_avx(auVar8,auVar54,4);
          auVar34 = vandps_avx(auVar34,auVar7);
          auVar75._0_4_ = local_2560._0_4_ + local_2560._16_4_;
          auVar75._4_4_ = local_2560._4_4_ + local_2560._20_4_;
          auVar75._8_4_ = local_2560._8_4_ + local_2560._24_4_;
          auVar75._12_4_ = local_2560._12_4_ + local_2560._28_4_;
          auVar7 = vcmpps_avx(auVar75,local_2530,2);
          auVar34 = vandps_avx(auVar34,auVar7);
          auVar9._8_8_ = uStack_2568;
          auVar9._0_8_ = local_2570;
          auVar9 = auVar9 & auVar34;
          if ((((auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar9[0xf] < '\0') {
            auVar13._8_8_ = uStack_2568;
            auVar13._0_8_ = local_2570;
            auVar34 = vandps_avx(auVar34,auVar13);
            auVar49._0_4_ = local_24b0[0]._0_4_ * auVar4._0_4_;
            auVar49._4_4_ = local_24b0[0]._4_4_ * auVar4._4_4_;
            auVar49._8_4_ = local_24b0[0]._8_4_ * auVar4._8_4_;
            auVar49._12_4_ = local_24b0[0]._12_4_ * auVar4._12_4_;
            auVar7 = vfmadd213ps_fma(auVar3,local_24c0,auVar49);
            auVar7 = vfmadd213ps_fma(auVar45,local_24d0,auVar7);
            local_2540._0_4_ = (float)(uVar16 ^ auVar7._0_4_);
            local_2540._4_4_ = (float)(uVar47 ^ auVar7._4_4_);
            local_2540._8_4_ = (float)(uVar67 ^ auVar7._8_4_);
            local_2540._12_4_ = (float)(uVar68 ^ auVar7._12_4_);
            fVar44 = *(float *)((long)&This->leafIntersector + 4);
            auVar43._0_4_ = local_2530._0_4_ * fVar44;
            auVar43._4_4_ = local_2530._4_4_ * fVar44;
            auVar43._8_4_ = local_2530._8_4_ * fVar44;
            auVar43._12_4_ = local_2530._12_4_ * fVar44;
            auVar7 = vcmpps_avx(auVar43,local_2540,1);
            fVar44 = *(float *)&(This->intersector1).intersect;
            auVar50._0_4_ = local_2530._0_4_ * fVar44;
            auVar50._4_4_ = local_2530._4_4_ * fVar44;
            auVar50._8_4_ = local_2530._8_4_ * fVar44;
            auVar50._12_4_ = local_2530._12_4_ * fVar44;
            auVar8 = vcmpps_avx(local_2540,auVar50,2);
            auVar7 = vandps_avx(auVar8,auVar7);
            auVar8 = auVar34 & auVar7;
            if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar8[0xf] < '\0') {
              auVar1._0_8_ = (This->intersector1).intersect;
              auVar1._8_8_ = (This->intersector1).occluded;
              auVar66 = ZEXT1664(auVar1);
              auVar34 = vandps_avx(auVar34,auVar7);
              local_2510 = auVar34;
              local_25f8 = *(long *)&(local_2608->super_RayK<1>).org.field_0;
              local_2640 = auVar34;
              auVar7 = vrcpps_avx(local_2530);
              auVar40._8_4_ = 0x3f800000;
              auVar40._0_8_ = 0x3f8000003f800000;
              auVar40._12_4_ = 0x3f800000;
              auVar8 = vfnmadd213ps_fma(local_2530,auVar7,auVar40);
              auVar7 = vfmadd132ps_fma(auVar8,auVar7,auVar7);
              fVar44 = auVar7._0_4_;
              local_24e0._0_4_ = fVar44 * local_2540._0_4_;
              fVar61 = auVar7._4_4_;
              local_24e0._4_4_ = fVar61 * local_2540._4_4_;
              fVar62 = auVar7._8_4_;
              local_24e0._8_4_ = fVar62 * local_2540._8_4_;
              fVar63 = auVar7._12_4_;
              local_24e0._12_4_ = fVar63 * local_2540._12_4_;
              auVar36 = ZEXT1664(local_24e0);
              local_2500[0] = fVar44 * local_2560._0_4_;
              local_2500[1] = fVar61 * local_2560._4_4_;
              local_2500[2] = fVar62 * local_2560._8_4_;
              local_2500[3] = fVar63 * local_2560._12_4_;
              local_24f0[0] = fVar44 * local_2560._16_4_;
              local_24f0[1] = fVar61 * local_2560._20_4_;
              local_24f0[2] = fVar62 * local_2560._24_4_;
              local_24f0[3] = fVar63 * local_2560._28_4_;
              auVar33._8_4_ = 0x7f800000;
              auVar33._0_8_ = 0x7f8000007f800000;
              auVar33._12_4_ = 0x7f800000;
              auVar7 = vblendvps_avx(auVar33,local_24e0,auVar34);
              auVar8 = vshufps_avx(auVar7,auVar7,0xb1);
              auVar8 = vminps_avx(auVar8,auVar7);
              auVar54 = vshufpd_avx(auVar8,auVar8,1);
              auVar8 = vminps_avx(auVar54,auVar8);
              auVar7 = vcmpps_avx(auVar7,auVar8,0);
              auVar8 = auVar34 & auVar7;
              if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar8[0xf] < '\0') {
                auVar34 = vandps_avx(auVar7,auVar34);
              }
              lVar23 = lVar23 + uVar30;
              uVar16 = vextractps_avx(auVar1,1);
              uVar19 = (ulong)context >> 0x20;
              uVar15 = vmovmskps_avx(auVar34);
              context = (RayQueryContext *)0x0;
              for (uVar19 = CONCAT44((int)uVar19,uVar15); (uVar19 & 1) == 0;
                  uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                context = (RayQueryContext *)((long)&context->scene + 1);
              }
              do {
                local_2590 = auVar66._0_16_;
                local_25a8 = *(uint *)(lVar23 + 0x90 + (long)context * 4);
                pRVar29 = *(RayQueryContext **)
                           (*(long *)(local_25f8 + 0x1e8) + (ulong)local_25a8 * 8);
                if ((*(uint *)((long)&pRVar29[2].scene + 4) & uVar16) == 0) {
                  *(undefined4 *)(local_2640 + (long)context * 4) = 0;
                }
                else {
                  local_2610 = *(RayQueryContext **)&(local_2608->super_RayK<1>).dir.field_0;
                  local_2580 = auVar36._0_16_;
                  if (local_2610->args == (RTCIntersectArguments *)0x0) {
                    local_25e0 = *(undefined4 **)
                                  ((long)&(local_2608->super_RayK<1>).org.field_0 + 8);
                    if (pRVar29[2].args == (RTCIntersectArguments *)0x0) {
                      fVar44 = local_2500[(long)context];
                      fVar61 = local_24f0[(long)context];
                      *(undefined4 *)&(This->intersector1).intersect =
                           *(undefined4 *)(local_24e0 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).pointQuery =
                           *(undefined4 *)(local_24d0 + (long)context * 4);
                      *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                           *(undefined4 *)(local_24c0 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).name =
                           *(undefined4 *)(local_24b0[0] + (long)context * 4);
                      *(float *)((long)&(This->intersector1).name + 4) = fVar44;
                      *(float *)&(This->intersector4).intersect = fVar61;
                      *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                           *(undefined4 *)(lVar23 + 0xa0 + (long)context * 4);
                      *(uint *)&(This->intersector4).occluded = local_25a8;
                      context = (RayQueryContext *)0x0;
                      *(undefined4 *)((long)&(This->intersector4).occluded + 4) = *local_25e0;
                      *(undefined4 *)&(This->intersector4).name = local_25e0[1];
                      break;
                    }
                    local_2630 = lVar20;
                    local_2628 = uVar24;
                    local_2620 = uVar26;
                    local_2618 = uVar25;
                  }
                  else {
                    local_2630 = lVar20;
                    local_2628 = uVar24;
                    local_2620 = uVar26;
                    local_2618 = uVar25;
                    local_25e0 = *(undefined4 **)
                                  ((long)&(local_2608->super_RayK<1>).org.field_0 + 8);
                  }
                  local_25c0 = *(undefined4 *)(local_24d0 + (long)context * 4);
                  local_25bc = *(undefined4 *)(local_24c0 + (long)context * 4);
                  local_25b8 = *(undefined4 *)(local_24b0[0] + (long)context * 4);
                  local_25b4 = local_2500[(long)context];
                  local_25b0 = local_24f0[(long)context];
                  local_25ac = *(undefined4 *)(lVar23 + 0xa0 + (long)context * 4);
                  local_25a4 = *local_25e0;
                  local_25a0 = local_25e0[1];
                  *(undefined4 *)&(This->intersector1).intersect =
                       *(undefined4 *)(local_24e0 + (long)context * 4);
                  local_2644 = -1;
                  local_25f0 = &local_2644;
                  pRVar21 = (RayQueryContext *)pRVar29[1].scene;
                  local_25e8 = pRVar21;
                  local_25d8 = This;
                  local_25d0 = &local_25c0;
                  local_25c8 = 1;
                  local_2630 = lVar20;
                  local_2628 = uVar24;
                  local_2620 = uVar26;
                  local_2618 = uVar25;
                  if (((pRVar29[2].args == (RTCIntersectArguments *)0x0) ||
                      ((*(code *)pRVar29[2].args)(&local_25f0), *local_25f0 != 0)) &&
                     ((local_2610->args == (RTCIntersectArguments *)0x0 ||
                      (((pRVar21 = local_2610, ((ulong)local_2610->scene & 2) == 0 &&
                        (pRVar21 = pRVar29, ((ulong)pRVar29[2].user & 0x40000000000000) == 0)) ||
                       ((*(code *)local_2610->args)(&local_25f0), *local_25f0 != 0)))))) {
                    *(undefined4 *)&(local_25d8->intersector1).pointQuery = *local_25d0;
                    *(undefined4 *)((long)&(local_25d8->intersector1).pointQuery + 4) =
                         local_25d0[1];
                    *(undefined4 *)&(local_25d8->intersector1).name = local_25d0[2];
                    *(undefined4 *)((long)&(local_25d8->intersector1).name + 4) = local_25d0[3];
                    *(undefined4 *)&(local_25d8->intersector4).intersect = local_25d0[4];
                    *(undefined4 *)((long)&(local_25d8->intersector4).intersect + 4) = local_25d0[5]
                    ;
                    *(undefined4 *)&(local_25d8->intersector4).occluded = local_25d0[6];
                    *(undefined4 *)((long)&(local_25d8->intersector4).occluded + 4) = local_25d0[7];
                    pRVar21 = (RayQueryContext *)0x0;
                    *(undefined4 *)&(local_25d8->intersector4).name = local_25d0[8];
                  }
                  else {
                    *(undefined4 *)&(This->intersector1).intersect = local_2590._0_4_;
                  }
                  *(undefined4 *)(local_2640 + (long)context * 4) = 0;
                  uVar15 = *(undefined4 *)&(This->intersector1).intersect;
                  auVar35._4_4_ = uVar15;
                  auVar35._0_4_ = uVar15;
                  auVar35._8_4_ = uVar15;
                  auVar35._12_4_ = uVar15;
                  auVar36 = ZEXT1664(local_2580);
                  auVar34 = vcmpps_avx(local_2580,auVar35,2);
                  local_2640 = vandps_avx(auVar34,local_2640);
                  auVar2._0_8_ = (This->intersector1).intersect;
                  auVar2._8_8_ = (This->intersector1).occluded;
                  auVar66 = ZEXT1664(auVar2);
                  uVar16 = vextractps_avx(auVar2,1);
                  context = pRVar21;
                  lVar20 = local_2630;
                  uVar24 = local_2628;
                  uVar25 = local_2618;
                  uVar26 = local_2620;
                }
                if ((((local_2640 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2640 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2640 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2640[0xf]) break;
                auVar41._8_4_ = 0x7f800000;
                auVar41._0_8_ = 0x7f8000007f800000;
                auVar41._12_4_ = 0x7f800000;
                auVar34 = vblendvps_avx(auVar41,auVar36._0_16_,local_2640);
                auVar7 = vshufps_avx(auVar34,auVar34,0xb1);
                auVar7 = vminps_avx(auVar7,auVar34);
                auVar8 = vshufpd_avx(auVar7,auVar7,1);
                auVar7 = vminps_avx(auVar8,auVar7);
                auVar7 = vcmpps_avx(auVar34,auVar7,0);
                auVar8 = local_2640 & auVar7;
                auVar34 = local_2640;
                if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar8[0xf] < '\0') {
                  auVar34 = vandps_avx(auVar7,local_2640);
                }
                uVar19 = (ulong)context >> 0x20;
                uVar15 = vmovmskps_avx(auVar34);
                context = (RayQueryContext *)0x0;
                for (uVar19 = CONCAT44((int)uVar19,uVar15); (uVar19 & 1) == 0;
                    uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  context = (RayQueryContext *)((long)&context->scene + 1);
                }
              } while( true );
            }
          }
          auVar66 = ZEXT3264(local_23c0);
          auVar70 = ZEXT3264(local_23e0);
          auVar76 = ZEXT3264(local_2400);
          auVar78 = ZEXT3264(local_2420);
          auVar81 = ZEXT3264(local_2440);
          auVar84 = ZEXT3264(local_2460);
          auVar86 = ZEXT3264(local_2480);
        }
        uVar15 = *(undefined4 *)&(This->intersector1).intersect;
        auVar36 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,
                                                  CONCAT412(uVar15,CONCAT48(uVar15,CONCAT44(uVar15,
                                                  uVar15))))))));
      }
      goto LAB_0152d226;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }